

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

int __thiscall
duckdb_re2::RepetitionWalker::PreVisit(RepetitionWalker *this,Regexp *re,int parent_arg,bool *stop)

{
  RegexpOp RVar1;
  int in_EDX;
  Regexp *in_RSI;
  int m;
  int arg;
  undefined4 local_28;
  undefined4 local_24;
  
  RVar1 = Regexp::op(in_RSI);
  local_24 = in_EDX;
  if (RVar1 == kRegexpRepeat) {
    local_28 = Regexp::max(in_RSI);
    if (local_28 < 0) {
      local_28 = Regexp::min(in_RSI);
    }
    if (0 < local_28) {
      local_24 = in_EDX / local_28;
    }
  }
  return local_24;
}

Assistant:

int RepetitionWalker::PreVisit(Regexp* re, int parent_arg, bool* stop) {
  int arg = parent_arg;
  if (re->op() == kRegexpRepeat) {
    int m = re->max();
    if (m < 0) {
      m = re->min();
    }
    if (m > 0) {
      arg /= m;
    }
  }
  return arg;
}